

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BOV.c
# Opt level: O2

void cursor_pos_callback(GLFWwindow *self,double x,double y)

{
  float fVar1;
  float fVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  void *pvVar5;
  uint uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double dVar11;
  
  pvVar5 = glfwGetWindowUserPointer(self);
  fVar1 = *(float *)((long)pvVar5 + 0x10);
  fVar2 = *(float *)((long)pvVar5 + 0x14);
  dVar11 = 1.0 - y / (double)*(int *)((long)pvVar5 + 0x38);
  uVar6 = (uint)(fVar2 < fVar1);
  auVar9._0_8_ = CONCAT44((int)(uVar6 << 0x1f) >> 0x1f,(int)(uVar6 << 0x1f) >> 0x1f);
  auVar9._8_4_ = (int)(uVar6 << 0x1f) >> 0x1f;
  auVar9._12_4_ = (int)(uVar6 << 0x1f) >> 0x1f;
  auVar7._8_8_ = dVar11 + dVar11 + -1.0;
  auVar7._0_8_ = (x + x) / (double)*(int *)((long)pvVar5 + 0x34) + -1.0;
  auVar10._0_8_ = ~auVar9._0_8_ & 0x3ff0000000000000;
  auVar10._8_8_ = ~auVar9._8_8_ & (ulong)(double)(fVar1 / fVar2);
  auVar8._8_4_ = 0;
  auVar8._0_8_ = (ulong)(double)(fVar2 / fVar1) & auVar9._0_8_;
  auVar8._12_4_ = auVar9._12_4_ & 0x3ff00000;
  dVar11 = (double)*(float *)((long)pvVar5 + 0x20) * SUB168(auVar10 | auVar8,8);
  auVar4._8_4_ = SUB84(dVar11,0);
  auVar4._0_8_ = (double)*(float *)((long)pvVar5 + 0x20) * SUB168(auVar10 | auVar8,0);
  auVar4._12_4_ = (int)((ulong)dVar11 >> 0x20);
  auVar8 = divpd(auVar7,auVar4);
  if ((0.0 < *(double *)((long)pvVar5 + 0x50)) || (0.0 < *(double *)((long)pvVar5 + 0x58))) {
    *(ulong *)((long)pvVar5 + 0x18) =
         CONCAT44((float)((ulong)*(undefined8 *)((long)pvVar5 + 0x18) >> 0x20) +
                  (float)(auVar8._8_8_ - *(double *)((long)pvVar5 + 0x48)),
                  (float)*(undefined8 *)((long)pvVar5 + 0x18) +
                  (float)(auVar8._0_8_ - *(double *)((long)pvVar5 + 0x40)));
  }
  dVar11 = (double)(float)auVar8._8_8_;
  auVar3._8_4_ = SUB84(dVar11,0);
  auVar3._0_8_ = (double)(float)auVar8._0_8_;
  auVar3._12_4_ = (int)((ulong)dVar11 >> 0x20);
  *(undefined1 (*) [16])((long)pvVar5 + 0x40) = auVar3;
  return;
}

Assistant:

static void cursor_pos_callback(GLFWwindow* self, double x, double y)
{
	bov_window_t* window = (bov_window_t*) glfwGetWindowUserPointer(self);

	double scale[2];
	if(window->param.res[0] > window->param.res[1]) {
		scale[0] = window->param.res[1] / window->param.res[0];
		scale[1] = 1.0;
	}
	else {
		scale[0] = 1.0;
		scale[1] = window->param.res[0] / window->param.res[1];
	}
	// TODO: modify this to use the scale
	double newX = (2.0 * x / window->size[0] - 1.0) /
	                (scale[0] * window->param.zoom);
	double newY = (2.0 * (1.0 - y / window->size[1]) - 1.0) /
	                (scale[1] * window->param.zoom);

	if(window->clickTime[0]>0.0 || window->clickTime[1]>0.0) {
		window->param.translate[0] += (GLfloat) (newX - window->cursorPos[0]);
		window->param.translate[1] += (GLfloat) (newY - window->cursorPos[1]);
	}

	window->cursorPos[0] = (GLfloat) newX;
	window->cursorPos[1] = (GLfloat) newY;
}